

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O0

bool __thiscall ConfusableMatcher::MatchWordBoundaryToLeft(ConfusableMatcher *this,CMStringView In)

{
  int iVar1;
  size_type sVar2;
  uchar *In_00;
  ConfusableMatcher *this_local;
  CMStringView In_local;
  
  In_local._M_len = (size_t)In._M_str;
  this_local = (ConfusableMatcher *)In._M_len;
  sVar2 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (sVar2 < 5) {
    sVar2 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
            size((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (sVar2 == 0) {
      In_local._M_str._7_1_ = false;
    }
    else {
      In_00 = (uchar *)std::experimental::fundamentals_v1::
                       basic_string_view<char,_std::char_traits<char>_>::data
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      sVar2 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
              size((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      iVar1 = MatchWordBoundary(this,In_00,(int)sVar2);
      if (iVar1 < 1) {
        In_local._M_str._7_1_ = false;
      }
      else {
        In_local._M_str._7_1_ = true;
      }
    }
    return In_local._M_str._7_1_;
  }
  __assert_fail("In.size() < 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/ConfusableMatcher.cpp"
                ,0x13f,"bool ConfusableMatcher::MatchWordBoundaryToLeft(CMStringView)");
}

Assistant:

bool ConfusableMatcher::MatchWordBoundaryToLeft(CMStringView In)
{
	/*
	 * When searching from right to left, it doesn't need to worry about anything special
	 * as first char will be always in the same spot
	 */
	assert(In.size() < 5);
	
	if (In.size() == 0)
		return false;

	/*
	 * Try to decode any kind of char, starting with smallest chars first.
	 * Here we don't care if we decode character that spans less bytes than we have in In.size()
	 * as start will always touch the match
	 */
	if (MatchWordBoundary((const unsigned char*)In.data(), In.size()) >= 1)
		return true;

	return false;
}